

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSRegExp * js_get_regexp(JSContext *ctx,JSValue obj,BOOL throw_error)

{
  JSObject *p;
  
  if (((int)obj.tag == -1) && (*(short *)((long)obj.u.ptr + 6) == 0x12)) {
    return (JSRegExp *)((long)obj.u.ptr + 0x30);
  }
  if (throw_error != 0) {
    JS_ThrowTypeErrorInvalidClass(ctx,0x12);
    return (JSRegExp *)0x0;
  }
  return (JSRegExp *)0x0;
}

Assistant:

static JSRegExp *js_get_regexp(JSContext *ctx, JSValueConst obj, BOOL throw_error)
{
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        JSObject *p = JS_VALUE_GET_OBJ(obj);
        if (p->class_id == JS_CLASS_REGEXP)
            return &p->u.regexp;
    }
    if (throw_error) {
        JS_ThrowTypeErrorInvalidClass(ctx, JS_CLASS_REGEXP);
    }
    return NULL;
}